

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<kj::String&,kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,kj *this,String *params,ArrayPtr<const_char> *params_1)

{
  ArrayPtr<const_char> *pAVar1;
  ArrayPtr<const_char> local_28;
  ArrayPtr<const_char> *local_18;
  undefined1 *local_10;
  
  pAVar1 = *(ArrayPtr<const_char> **)(this + 8);
  local_18 = pAVar1;
  if (pAVar1 != (ArrayPtr<const_char> *)0x0) {
    local_18 = *(ArrayPtr<const_char> **)this;
  }
  local_10 = (undefined1 *)0x0;
  if (pAVar1 != (ArrayPtr<const_char> *)0x0) {
    local_10 = (undefined1 *)((long)&pAVar1[-1].size_ + 7);
  }
  local_28.ptr = (params->content).ptr;
  local_28.size_ = (params->content).size_;
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_18,&local_28,local_18);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}